

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O0

void __thiscall
Qentem::HArray<Qentem::String<char>,_Qentem::Value<char>_>::Insert
          (HArray<Qentem::String<char>,_Qentem::Value<char>_> *this,String<char> *key,
          Value<char> *value)

{
  SizeT SVar1;
  SizeT SVar2;
  char *pcVar3;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar4;
  String<char> *key_00;
  Value<char> *pVVar5;
  HItem *item;
  SizeT *index;
  Value<char> *pVStack_20;
  SizeT hash;
  Value<char> *value_local;
  String<char> *key_local;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> *this_local;
  
  pVStack_20 = value;
  value_local = (Value<char> *)key;
  key_local = (String<char> *)this;
  SVar1 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          ::Size(&this->
                  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                );
  SVar2 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          ::Capacity(&this->
                      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                    );
  if (SVar1 == SVar2) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    expand(&this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          );
  }
  pcVar3 = String<char>::First((String<char> *)value_local);
  SVar1 = String<char>::Length((String<char> *)value_local);
  index._4_4_ = StringUtils::Hash<char>(pcVar3,SVar1);
  pcVar3 = String<char>::First((String<char> *)value_local);
  SVar1 = String<char>::Length((String<char> *)value_local);
  pHVar4 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::find(&this->
                   super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                  ,(SizeT **)&item,pcVar3,SVar1,index._4_4_);
  if (pHVar4 == (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)0x0) {
    key_00 = Memory::Move<Qentem::String<char>>((String<char> *)value_local);
    pHVar4 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::insert(&this->
                       super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                      ,(SizeT *)item,key_00,index._4_4_);
    pVVar5 = Memory::Move<Qentem::Value<char>>(pVStack_20);
    Memory::Initialize<Qentem::Value<char>>(&pHVar4->Value,pVVar5);
  }
  else {
    pVVar5 = Memory::Move<Qentem::Value<char>>(pVStack_20);
    Value<char>::operator=(&pHVar4->Value,pVVar5);
  }
  return;
}

Assistant:

void Insert(Key_T &&key, Value_T &&value) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key.First(), key.Length());
        SizeT      *index;
        HItem      *item = find(index, key.First(), key.Length(), hash);

        if (item == nullptr) {
            item = insert(index, Memory::Move(key), hash);
            Memory::Initialize(&(item->Value), Memory::Move(value));
        } else {
            item->Value = Memory::Move(value);
        }
    }